

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,LogicalType *key_type,
                          LogicalType *value_type,vector<duckdb::Value,_true> *keys,
                          vector<duckdb::Value,_true> *values)

{
  pointer pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pVVar2;
  undefined1 *puVar3;
  Value *pVVar4;
  vector<duckdb::Value,_true> *this_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 this_01;
  undefined4 uVar8;
  reference pvVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_type __n;
  ExtraValueInfo *__tmp;
  pointer pVVar11;
  Value *this_02;
  undefined4 uVar12;
  undefined4 uVar13;
  vector<duckdb::Value,_true> new_children;
  child_list_t<LogicalType> struct_types;
  Value key;
  LogicalType struct_type;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unique_keys;
  Value *local_1e8;
  Value *pVStack_1e0;
  pointer local_1d8;
  vector<duckdb::Value,_true> local_1c8;
  vector<duckdb::Value,_true> *local_1a8;
  LogicalType *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_160 [64];
  char *local_120;
  LogicalType local_118 [2];
  LogicalType local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  LogicalType local_b0;
  LogicalType local_98;
  LogicalType local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_1a8 = keys;
  local_1a0 = value_type;
  LogicalType::LogicalType(&local_80,SQLNULL);
  Value(__return_storage_ptr__,&local_80);
  LogicalType::~LogicalType(&local_80);
  LogicalType::LogicalType(&local_98,key_type);
  LogicalType::LogicalType(&local_b0,local_1a0);
  LogicalType::MAP((LogicalType *)local_160,&local_98,&local_b0);
  (__return_storage_ptr__->type_).id_ = local_160[0];
  (__return_storage_ptr__->type_).physical_type_ = local_160[1];
  local_178._0_4_ =
       *(undefined4 *)
        &(__return_storage_ptr__->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178._4_4_ =
       *(undefined4 *)
        ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
  uVar12 = *(undefined4 *)
            &(__return_storage_ptr__->type_).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar13 = *(undefined4 *)
            ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar5 = local_160._8_4_;
  uVar6 = local_160._12_4_;
  uVar7 = local_160._16_4_;
  uVar8 = local_160._20_4_;
  local_160._8_8_ = (element_type *)0x0;
  local_160._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var10 = (__return_storage_ptr__->type_).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined4 *)
   &(__return_storage_ptr__->type_).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->type_).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar6
  ;
  *(undefined4 *)
   &(__return_storage_ptr__->type_).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar7;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->type_).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
   4) = uVar8;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uStack_170 = uVar12;
    uStack_16c = uVar13;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    uVar12 = uStack_170;
    uVar13 = uStack_16c;
  }
  this_01 = local_160._16_8_;
  local_160._12_4_ = local_178._4_4_;
  local_160._8_4_ = (undefined4)local_178;
  local_160._20_4_ = uVar13;
  local_160._16_4_ = uVar12;
  local_178 = key_type;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  LogicalType::~LogicalType((LogicalType *)local_160);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType(&local_98);
  __return_storage_ptr__->is_null = false;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if ((local_1a8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_1a8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_00 = local_1a8;
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      local_1d8 = (pointer)0x0;
      local_1e8 = (Value *)0x0;
      pVStack_1e0 = (Value *)0x0;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_198,2);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8,2);
      local_120 = "key";
      LogicalType::LogicalType(local_118,local_178);
      ::std::__cxx11::string::string((string *)local_160,local_120,(allocator *)&local_e0);
      LogicalType::LogicalType((LogicalType *)(local_160 + 0x20),local_118);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_198,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)local_160);
      LogicalType::~LogicalType((LogicalType *)(local_160 + 0x20));
      puVar3 = (undefined1 *)CONCAT62(local_160._2_6_,CONCAT11(local_160[1],local_160[0]));
      if (puVar3 != local_160 + 0x10) {
        operator_delete(puVar3);
      }
      LogicalType::~LogicalType(local_118);
      local_120 = "value";
      LogicalType::LogicalType(local_118,local_1a0);
      ::std::__cxx11::string::string((string *)local_160,local_120,(allocator *)&local_e0);
      LogicalType::LogicalType((LogicalType *)(local_160 + 0x20),local_118);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_198,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)local_160);
      LogicalType::~LogicalType((LogicalType *)(local_160 + 0x20));
      puVar3 = (undefined1 *)CONCAT62(local_160._2_6_,CONCAT11(local_160[1],local_160[0]));
      if (puVar3 != local_160 + 0x10) {
        operator_delete(puVar3);
      }
      LogicalType::~LogicalType(local_118);
      pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,__n);
      DefaultCastAs((Value *)local_160,pvVar9,local_178,false);
      MapKeyCheck((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_68,(Value *)local_160);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8,
                 (Value *)local_160);
      pvVar9 = vector<duckdb::Value,_true>::operator[](values,__n);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8,pvVar9);
      local_c8 = local_198;
      uStack_c0 = uStack_190;
      local_b8 = local_188;
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      LogicalType::STRUCT(&local_e0,(child_list_t<LogicalType> *)&local_c8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_c8);
      local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_1e8;
      local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_1e0;
      local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1d8;
      local_1e8 = (Value *)0x0;
      pVStack_1e0 = (Value *)0x0;
      local_1d8 = (pointer)0x0;
      STRUCT((Value *)&local_120,&local_e0,&local_1c8);
      pvVar9 = vector<duckdb::Value,_true>::operator[](values,__n);
      operator=(pvVar9,(Value *)&local_120);
      ~Value((Value *)&local_120);
      pVVar1 = local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar11 = local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start; pVVar11 != pVVar1; pVVar11 = pVVar11 + 1) {
        ~Value(pVVar11);
      }
      if (local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start != (Value *)0x0) {
        operator_delete(local_1c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      LogicalType::~LogicalType(&local_e0);
      ~Value((Value *)local_160);
      pVVar4 = pVStack_1e0;
      for (this_02 = local_1e8; this_02 != pVVar4; this_02 = this_02 + 1) {
        ~Value(this_02);
      }
      if (local_1e8 != (Value *)0x0) {
        operator_delete(local_1e8);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_198);
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_1a8->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_1a8->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var10->_M_use_count = 1;
  p_Var10->_M_weak_count = 1;
  p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02478eb0;
  pVVar1 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pVVar11 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar2 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&p_Var10[1]._M_use_count = 2;
  p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NestedValueInfo_02478f00;
  p_Var10[2]._vptr__Sp_counted_base = (_func_int **)pVVar11;
  *(pointer *)&p_Var10[2]._M_use_count = pVVar2;
  p_Var10[3]._vptr__Sp_counted_base = (_func_int **)pVVar1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var10->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var10 + 1);
  this = (__return_storage_ptr__->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var10
  ;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Value Value::MAP(const LogicalType &key_type, const LogicalType &value_type, vector<Value> keys, vector<Value> values) {
	D_ASSERT(keys.size() == values.size());
	Value result;

	result.type_ = LogicalType::MAP(key_type, value_type);
	result.is_null = false;
	unordered_set<hash_t> unique_keys;

	for (idx_t i = 0; i < keys.size(); i++) {
		child_list_t<LogicalType> struct_types;
		vector<Value> new_children;
		struct_types.reserve(2);
		new_children.reserve(2);

		struct_types.push_back(make_pair("key", key_type));
		struct_types.push_back(make_pair("value", value_type));

		auto key = keys[i].DefaultCastAs(key_type);
		MapKeyCheck(unique_keys, key);

		new_children.push_back(key);
		new_children.push_back(values[i]);
		auto struct_type = LogicalType::STRUCT(std::move(struct_types));
		values[i] = Value::STRUCT(struct_type, std::move(new_children));
	}

	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(values));
	return result;
}